

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

bool __thiscall UniValue::setInt(UniValue *this,int64_t val_)

{
  bool bVar1;
  ostringstream oss;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<long>((long)local_190);
  std::__cxx11::stringbuf::str();
  bVar1 = setNumStr(this,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return bVar1;
}

Assistant:

bool UniValue::setInt(int64_t val_)
{
    std::ostringstream oss;

    oss << val_;

    return setNumStr(oss.str());
}